

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O0

bool __thiscall glu::ES2ContextInfo::isFragmentDynamicLoopSupported(ES2ContextInfo *this)

{
  bool *pbVar1;
  ES2ContextInfo *this_local;
  
  pbVar1 = CachedValue<bool,_glu::TryCompileProgram>::getValue
                     (&this->m_fragmentDynamicLoopsSupported,(this->super_ContextInfo).m_context);
  return (bool)(*pbVar1 & 1);
}

Assistant:

bool								isFragmentDynamicLoopSupported		(void) const	{ return m_fragmentDynamicLoopsSupported.getValue(m_context);	}